

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

Spins * __thiscall
openjij::graph::Graph::gen_spin<openjij::utility::Xorshift>
          (Spins *__return_storage_ptr__,Graph *this,Xorshift *random_numder_engine)

{
  int *piVar1;
  result_type_conflict rVar2;
  Spins *__range3;
  int *elem;
  int *piVar3;
  uniform_int_distribution<int> uid;
  allocator_type local_31;
  param_type local_30;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,this->_num_spins,&local_31);
  local_30._M_a = 0;
  local_30._M_b = 1;
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar3 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_30,random_numder_engine);
    *piVar3 = rVar2 * 2 + -1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Spins gen_spin(RandomNumberEngine &random_numder_engine) const {
    // generate spin array
    Spins ret_spin(_num_spins);

    std::uniform_int_distribution<> uid(0, 1);
    for (auto &elem : ret_spin) {
      elem = 2 * uid(random_numder_engine) - 1;
    }

    return ret_spin;
  }